

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_page_element * nk_pool_alloc(nk_pool *pool)

{
  uint uVar1;
  long lVar2;
  undefined4 *puVar3;
  undefined8 *in_RDI;
  nk_size size;
  nk_page *page;
  
  if ((in_RDI[4] == 0) || (*(uint *)(in_RDI + 6) <= *(uint *)in_RDI[4])) {
    if (*(int *)(in_RDI + 3) == 0) {
      if (in_RDI[4] == 0) {
        return (nk_page_element *)0x0;
      }
      return (nk_page_element *)0x0;
    }
    puVar3 = (undefined4 *)
             (*(code *)in_RDI[1])(*in_RDI,0,(ulong)(*(int *)(in_RDI + 6) - 1) * 0x200 + 0x210);
    *(undefined8 *)(puVar3 + 2) = in_RDI[4];
    in_RDI[4] = puVar3;
    *puVar3 = 0;
  }
  lVar2 = in_RDI[4];
  uVar1 = *(uint *)in_RDI[4];
  *(uint *)in_RDI[4] = uVar1 + 1;
  return (nk_page_element *)(lVar2 + 0x10 + (ulong)uVar1 * 0x200);
}

Assistant:

NK_LIB struct nk_page_element*
nk_pool_alloc(struct nk_pool *pool)
{
if (!pool->pages || pool->pages->size >= pool->capacity) {
/* allocate new page */
struct nk_page *page;
if (pool->type == NK_BUFFER_FIXED) {
NK_ASSERT(pool->pages);
if (!pool->pages) return 0;
NK_ASSERT(pool->pages->size < pool->capacity);
return 0;
} else {
nk_size size = sizeof(struct nk_page);
size += (pool->capacity - 1) * sizeof(struct nk_page_element);
page = (struct nk_page*)pool->alloc.alloc(pool->alloc.userdata,0, size);
page->next = pool->pages;
pool->pages = page;
page->size = 0;
}
} return &pool->pages->win[pool->pages->size++];
}